

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

char * ndiSerialDeviceName(int i)

{
  if ((uint)i < 8) {
    return &DAT_0010e480 + *(int *)(&DAT_0010e480 + (ulong)(uint)i * 4);
  }
  return (char *)0x0;
}

Assistant:

ndicapiExport const char* ndiSerialDeviceName(int i)
{
#if defined(_WIN32)

  // Windows
  const size_t MAX_BUF_LEN = 100;
  static char deviceName[100 + 1];
  char deviceNumber[100 + 1];
  int comPortNumber;
  comPortNumber = i + 1;
  deviceName[MAX_BUF_LEN] = 0;
  deviceNumber[MAX_BUF_LEN] = 0;
  if (comPortNumber < 1)
  {
    return NULL;
  }
  // COM port name format is different for port number under/over 10 (see Microsoft KB115831)
  if (comPortNumber < 10)
  {
    strcpy_s(deviceName, MAX_BUF_LEN, "COM");
  }
  else
  {
    strcpy_s(deviceName, MAX_BUF_LEN, "\\\\.\\COM");
  }
  _itoa_s(comPortNumber, deviceNumber, MAX_BUF_LEN, 10);
  strcat_s(deviceName, MAX_BUF_LEN, deviceNumber);
  return deviceName;

#elif defined (__APPLE__)

  // Apple
  static char devicename[255 + 6];
  DIR* dirp;
  struct dirent* ep;
  int j = 0;

  dirp = opendir("/dev/");
  if (dirp == NULL)
  {
    return NULL;
  }

  while ((ep = readdir(dirp)) != NULL && j <= i)
  {
    if (ep->d_name[0] == 'c' && ep->d_name[1] == 'u' &&
        ep->d_name[2] == '.')
    {
      if (j == i)
      {
        strncpy(devicename, "/dev/", 5);
        strncpy(devicename + 5, ep->d_name, 255);
        devicename[255 + 5] = '\0';
        closedir(dirp);
        return devicename;
      }
      j++;
    }
  }
  closedir(dirp);
  return NULL;

#else

  // Linux/Unix variants

#ifdef NDI_DEVICE0
  if (i == 0)
  {
    return NDI_DEVICE0;
  }
#endif
#ifdef NDI_DEVICE1
  if (i == 1)
  {
    return NDI_DEVICE1;
  }
#endif
#ifdef NDI_DEVICE2
  if (i == 2)
  {
    return NDI_DEVICE2;
  }
#endif
#ifdef NDI_DEVICE3
  if (i == 3)
  {
    return NDI_DEVICE3;
  }
#endif
#ifdef NDI_DEVICE4
  if (i == 4)
  {
    return NDI_DEVICE4;
  }
#endif
#ifdef NDI_DEVICE5
  if (i == 5)
  {
    return NDI_DEVICE5;
  }
#endif
#ifdef NDI_DEVICE6
  if (i == 6)
  {
    return NDI_DEVICE6;
  }
#endif
#ifdef NDI_DEVICE7
  if (i == 7)
  {
    return NDI_DEVICE7;
  }
#endif

  return NULL;

#endif
}